

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

Int64ToDoubleMap *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::Int64ToDoubleMap>
          (Arena *arena)

{
  Int64ToDoubleMap *this;
  
  if (arena == (Arena *)0x0) {
    this = (Int64ToDoubleMap *)operator_new(0x48);
    CoreML::Specification::Int64ToDoubleMap::Int64ToDoubleMap(this,(Arena *)0x0,false);
  }
  else {
    this = (Int64ToDoubleMap *)
           AllocateAlignedWithHook
                     (arena,0x48,(type_info *)&CoreML::Specification::Int64ToDoubleMap::typeinfo);
    CoreML::Specification::Int64ToDoubleMap::Int64ToDoubleMap(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }